

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_finalize_buffer(flatcc_builder_t *B,size_t *size_out)

{
  void *buffer;
  void *pvVar1;
  size_t __size;
  
  __size = (long)B->emit_end - (long)B->emit_start;
  if (size_out != (size_t *)0x0) {
    *size_out = __size;
  }
  buffer = malloc(__size);
  if (buffer != (void *)0x0) {
    pvVar1 = flatcc_builder_copy_buffer(B,buffer,__size);
    if (pvVar1 != (void *)0x0) {
      return buffer;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x7c1,"void *flatcc_builder_finalize_buffer(flatcc_builder_t *, size_t *)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x7bd,"void *flatcc_builder_finalize_buffer(flatcc_builder_t *, size_t *)");
}

Assistant:

void *flatcc_builder_finalize_buffer(flatcc_builder_t *B, size_t *size_out)
{
    void * buffer;
    size_t size;

    size = flatcc_builder_get_buffer_size(B);

    if (size_out) {
        *size_out = size;
    }

    buffer = FLATCC_BUILDER_ALLOC(size);

    if (!buffer) {
        check(0, "failed to allocated memory for finalized buffer");
        goto done;
    }
    if (!flatcc_builder_copy_buffer(B, buffer, size)) {
        check(0, "default emitter declined to copy buffer");
        FLATCC_BUILDER_FREE(buffer);
        buffer = 0;
    }
done:
    if (!buffer && size_out) {
        *size_out = 0;
    }
    return buffer;
}